

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quit.cpp
# Opt level: O3

void pstore::http::quit(not_null<pstore::maybe<pstore::http::server_status,_void>_*> http_status)

{
  http_state hVar1;
  long lVar2;
  undefined8 *puVar3;
  not_null<const_char_*> nVar4;
  in_port_t iVar5;
  int iVar6;
  int iVar7;
  server_status *this;
  int *piVar8;
  long *plVar9;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_1;
  undefined8 *puVar10;
  long *in_FS_OFFSET;
  sockaddr_in sock_addr;
  sockaddr local_98;
  int local_80;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  not_null<const_char_*> local_38;
  not_null<const_char_*> local_30;
  
  if ((http_status.ptr_)->valid_ == true) {
    this = maybe<pstore::http::server_status,_void>::operator->(http_status.ptr_);
    LOCK();
    hVar1 = (this->state_)._M_i;
    (this->state_)._M_i = closing;
    UNLOCK();
    if (hVar1 == listening) {
      iVar6 = socket(2,1,0);
      local_80 = iVar6;
      if (iVar6 < 0) {
        piVar8 = __errno_location();
        iVar6 = *piVar8;
        plVar9 = (long *)std::_V2::generic_category();
        (**(code **)(*plVar9 + 0x20))(local_58,plVar9,iVar6);
        pstore::details::log_destinations::__tls_init();
        lVar2 = *in_FS_OFFSET;
        if (*(long *)(lVar2 + -8) != 0) {
          pstore::details::log_destinations::__tls_init();
          puVar10 = *(undefined8 **)(lVar2 + -8);
          puVar3 = (undefined8 *)puVar10[1];
          for (puVar10 = (undefined8 *)*puVar10; puVar10 != puVar3; puVar10 = puVar10 + 1) {
            (**(code **)(*(long *)*puVar10 + 0x50))
                      ((long *)*puVar10,3,"Could not open socket: ",local_58[0]);
          }
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
      }
      else {
        local_98.sa_family = 0;
        local_98.sa_data[0] = '\0';
        local_98.sa_data[1] = '\0';
        local_98.sa_data[2] = '\0';
        local_98.sa_data[3] = '\0';
        local_98.sa_data[4] = '\0';
        local_98.sa_data[5] = '\0';
        local_98.sa_data[6] = '\0';
        local_98.sa_data[7] = '\0';
        local_98.sa_data[8] = '\0';
        local_98.sa_data[9] = '\0';
        local_98.sa_data[10] = '\0';
        local_98.sa_data[0xb] = '\0';
        local_98.sa_data[0xc] = '\0';
        local_98.sa_data[0xd] = '\0';
        iVar5 = server_status::port(this);
        local_98.sa_data._2_4_ = 0;
        local_98.sa_data._0_2_ = iVar5 << 8 | iVar5 >> 8;
        local_98.sa_family = 2;
        local_98.sa_data._2_4_ = 0x100007f;
        local_30.ptr_ = "Connecting";
        pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_30);
        nVar4.ptr_ = local_30.ptr_;
        pstore::details::log_destinations::__tls_init();
        lVar2 = *in_FS_OFFSET;
        if (*(long *)(lVar2 + -8) != 0) {
          pstore::details::log_destinations::__tls_init();
          puVar10 = *(undefined8 **)(lVar2 + -8);
          puVar3 = (undefined8 *)puVar10[1];
          for (puVar10 = (undefined8 *)*puVar10; puVar10 != puVar3; puVar10 = puVar10 + 1) {
            (**(code **)(*(long *)*puVar10 + 0x48))((long *)*puVar10,6,nVar4.ptr_);
          }
        }
        iVar7 = connect(iVar6,&local_98,0x10);
        if (iVar7 == 0) {
          local_38.ptr_ = "Connected";
          pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_38);
          nVar4.ptr_ = local_38.ptr_;
          pstore::details::log_destinations::__tls_init();
          lVar2 = *in_FS_OFFSET;
          if (*(long *)(lVar2 + -8) != 0) {
            pstore::details::log_destinations::__tls_init();
            puVar10 = *(undefined8 **)(lVar2 + -8);
            puVar3 = (undefined8 *)puVar10[1];
            for (puVar10 = (undefined8 *)*puVar10; puVar10 != puVar3; puVar10 = puVar10 + 1) {
              (**(code **)(*(long *)*puVar10 + 0x48))((long *)*puVar10,6,nVar4.ptr_);
            }
          }
        }
        else {
          piVar8 = __errno_location();
          iVar7 = *piVar8;
          plVar9 = (long *)std::_V2::generic_category();
          (**(code **)(*plVar9 + 0x20))(local_78,plVar9,iVar7);
          pstore::details::log_destinations::__tls_init();
          lVar2 = *in_FS_OFFSET;
          if (*(long *)(lVar2 + -8) != 0) {
            pstore::details::log_destinations::__tls_init();
            puVar10 = *(undefined8 **)(lVar2 + -8);
            puVar3 = (undefined8 *)puVar10[1];
            for (puVar10 = (undefined8 *)*puVar10; puVar10 != puVar3; puVar10 = puVar10 + 1) {
              (**(code **)(*(long *)*puVar10 + 0x50))
                        ((long *)*puVar10,3,"Could not connect to localhost: ",local_78[0]);
            }
          }
          if (local_78[0] != local_68) {
            operator_delete(local_78[0],local_68[0] + 1);
          }
        }
        piVar8 = __errno_location();
        iVar7 = *piVar8;
        close(iVar6);
        *piVar8 = iVar7;
      }
    }
  }
  return;
}

Assistant:

void quit (gsl::not_null<maybe<server_status> *> http_status) {
            if (!http_status->has_value ()) {
                return;
            }
            auto & s = **http_status;
            if (s.set_state_to_shutdown () == server_status::http_state::listening) {
                // The server was previously in the listening state so we must wake it up by
                // connecting.
                socket_descriptor const fd{::socket (AF_INET, SOCK_STREAM, IPPROTO_IP)};
                if (!fd.valid ()) {
                    log (logger::priority::error,
                         "Could not open socket: ", get_last_error ().message ());
                    return;
                }

                struct sockaddr_in sock_addr {};
                // NOLINTNEXTLINE
                sock_addr.sin_port = htons (s.port ()); //! OCLINT
                sock_addr.sin_family = AF_INET;
                // NOLINTNEXTLINE
                sock_addr.sin_addr.s_addr = htonl (INADDR_LOOPBACK); //! OCLINT

                log (logger::priority::info, "Connecting");

                if (::connect (fd.native_handle (),
                               reinterpret_cast<struct sockaddr *> (&sock_addr),
                               sizeof (sock_addr)) != 0) {
                    // Perhaps another connection happened before the one that we're attempting here
                    // and the server has already shutdown.
                    log (logger::priority::error,
                         "Could not connect to localhost: ", get_last_error ().message ());
                    return;
                }

                log (logger::priority::info, "Connected");
            }
        }